

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BaseFab.H
# Opt level: O2

double * __thiscall amrex::BaseFab<double>::dataPtr(BaseFab<double> *this,int n)

{
  Long LVar1;
  double *pdVar2;
  
  pdVar2 = this->dptr;
  if (pdVar2 == (double *)0x0) {
    pdVar2 = (double *)0x0;
  }
  else {
    LVar1 = Box::numPts(&this->domain);
    pdVar2 = pdVar2 + LVar1 * n;
  }
  return pdVar2;
}

Assistant:

T* dataPtr (int n = 0) noexcept {
        if (this->dptr) {
            return &(this->dptr[n*this->domain.numPts()]);
        } else {
            return nullptr;
        }
    }